

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::CompilerGLSL::CompilerGLSL
          (CompilerGLSL *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *spirv_)

{
  EVP_PKEY_CTX *ctx;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start =
       (spirv_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       (spirv_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  ctx = (EVP_PKEY_CTX *)&local_48;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       (spirv_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (spirv_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (spirv_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (spirv_->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Compiler::Compiler(&this->super_Compiler,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)ctx);
  ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  (this->super_Compiler)._vptr_Compiler = (_func_int **)&PTR__CompilerGLSL_00ac2a30;
  this->current_emitting_block = (SPIRBlock *)0x0;
  (this->current_emitting_switch_stack).super_VectorView<diligent_spirv_cross::SPIRBlock_*>.
  buffer_size = 0;
  (this->current_emitting_switch_stack).super_VectorView<diligent_spirv_cross::SPIRBlock_*>.ptr =
       (SPIRBlock **)&(this->current_emitting_switch_stack).stack_storage;
  (this->current_emitting_switch_stack).buffer_capacity = 8;
  this->current_emitting_switch_fallthrough = false;
  StringStream<4096UL,_4096UL>::StringStream(&this->buffer);
  this->redirect_statement =
       (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        *)0x0;
  this->current_continue_block = (SPIRBlock *)0x0;
  this->block_temporary_hoisting = false;
  this->block_debug_directives = false;
  Options::Options(&this->options);
  (this->local_variable_names)._M_h._M_buckets = &(this->local_variable_names)._M_h._M_single_bucket
  ;
  (this->local_variable_names)._M_h._M_bucket_count = 1;
  (this->local_variable_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->local_variable_names)._M_h._M_element_count = 0;
  (this->local_variable_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->local_variable_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->local_variable_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->resource_names)._M_h._M_buckets = &(this->resource_names)._M_h._M_single_bucket;
  (this->resource_names)._M_h._M_bucket_count = 1;
  (this->resource_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->resource_names)._M_h._M_element_count = 0;
  (this->resource_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->resource_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->resource_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->block_input_names)._M_h._M_buckets = &(this->block_input_names)._M_h._M_single_bucket;
  (this->block_input_names)._M_h._M_bucket_count = 1;
  (this->block_input_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_input_names)._M_h._M_element_count = 0;
  (this->block_input_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block_input_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block_input_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->block_output_names)._M_h._M_buckets = &(this->block_output_names)._M_h._M_single_bucket;
  (this->block_output_names)._M_h._M_bucket_count = 1;
  (this->block_output_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_output_names)._M_h._M_element_count = 0;
  (this->block_output_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block_output_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block_output_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->block_ubo_names)._M_h._M_buckets = &(this->block_ubo_names)._M_h._M_single_bucket;
  (this->block_ubo_names)._M_h._M_bucket_count = 1;
  (this->block_ubo_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_ubo_names)._M_h._M_element_count = 0;
  (this->block_ubo_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block_ubo_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block_ubo_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->block_ssbo_names)._M_h._M_buckets = &(this->block_ssbo_names)._M_h._M_single_bucket;
  (this->block_ssbo_names)._M_h._M_bucket_count = 1;
  (this->block_ssbo_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_ssbo_names)._M_h._M_element_count = 0;
  (this->block_ssbo_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block_ssbo_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block_ssbo_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->block_names)._M_h._M_buckets = &(this->block_names)._M_h._M_single_bucket;
  (this->block_names)._M_h._M_bucket_count = 1;
  (this->block_names)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_names)._M_h._M_element_count = 0;
  (this->block_names)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block_names)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block_names)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->function_overloads)._M_h._M_buckets = &(this->function_overloads)._M_h._M_single_bucket;
  (this->function_overloads)._M_h._M_bucket_count = 1;
  (this->function_overloads)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->function_overloads)._M_h._M_element_count = 0;
  (this->function_overloads)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->function_overloads)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->function_overloads)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->preserved_aliases)._M_h._M_buckets = &(this->preserved_aliases)._M_h._M_single_bucket;
  (this->preserved_aliases)._M_h._M_bucket_count = 1;
  (this->preserved_aliases)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->preserved_aliases)._M_h._M_element_count = 0;
  (this->preserved_aliases)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->preserved_aliases)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->preserved_aliases)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->processing_entry_point = false;
  BackendVariations::BackendVariations(&this->backend);
  this->indent = 0;
  (this->emitted_functions)._M_h._M_buckets = &(this->emitted_functions)._M_h._M_single_bucket;
  (this->emitted_functions)._M_h._M_bucket_count = 1;
  (this->emitted_functions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->emitted_functions)._M_h._M_element_count = 0;
  (this->emitted_functions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->emitted_functions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->emitted_functions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->flushed_phi_variables)._M_h._M_buckets =
       &(this->flushed_phi_variables)._M_h._M_single_bucket;
  (this->flushed_phi_variables)._M_h._M_bucket_count = 1;
  (this->flushed_phi_variables)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->flushed_phi_variables)._M_h._M_element_count = 0;
  (this->flushed_phi_variables)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->flushed_phi_variables)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->flushed_phi_variables)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->flattened_buffer_blocks)._M_h._M_buckets =
       &(this->flattened_buffer_blocks)._M_h._M_single_bucket;
  (this->flattened_buffer_blocks)._M_h._M_bucket_count = 1;
  (this->flattened_buffer_blocks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->flattened_buffer_blocks)._M_h._M_element_count = 0;
  (this->flattened_buffer_blocks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->flattened_buffer_blocks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->flattened_buffer_blocks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->flattened_structs)._M_h._M_buckets = &(this->flattened_structs)._M_h._M_single_bucket;
  (this->flattened_structs)._M_h._M_bucket_count = 1;
  (this->flattened_structs)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->flattened_structs)._M_h._M_element_count = 0;
  (this->flattened_structs)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->flattened_structs)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->flattened_structs)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->shader_subgroup_supporter).feature_mask = 0;
  (this->expression_usage_counts)._M_h._M_buckets =
       &(this->expression_usage_counts)._M_h._M_single_bucket;
  (this->expression_usage_counts)._M_h._M_bucket_count = 1;
  (this->expression_usage_counts)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->expression_usage_counts)._M_h._M_element_count = 0;
  (this->expression_usage_counts)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->expression_usage_counts)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->expression_usage_counts)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->forced_extensions).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  (this->forced_extensions).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(this->forced_extensions).stack_storage;
  (this->forced_extensions).buffer_capacity = 8;
  (this->header_lines).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .buffer_size = 0;
  (this->header_lines).
  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &(this->header_lines).stack_storage;
  (this->header_lines).buffer_capacity = 8;
  (this->extra_sub_expressions)._M_h._M_buckets =
       &(this->extra_sub_expressions)._M_h._M_single_bucket;
  (this->extra_sub_expressions)._M_h._M_bucket_count = 1;
  (this->extra_sub_expressions)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->extra_sub_expressions)._M_h._M_element_count = 0;
  (this->extra_sub_expressions)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->extra_sub_expressions)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->extra_sub_expressions)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->workaround_ubo_load_overload_types).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.buffer_size = 0;
  (this->workaround_ubo_load_overload_types).
  super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>.ptr =
       (TypedID<(diligent_spirv_cross::Types)1> *)
       &(this->workaround_ubo_load_overload_types).stack_storage;
  (this->workaround_ubo_load_overload_types).buffer_capacity = 8;
  *(undefined8 *)((long)&this->required_polyfills + 2) = 0;
  this->statement_count = 0;
  this->required_polyfills = 0;
  (this->inout_color_attachments).
  super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inout_color_attachments).
  super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subpass_to_framebuffer_fetch_attachment).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->inout_color_attachments).
  super__Vector_base<std::pair<unsigned_int,_bool>,_std::allocator<std::pair<unsigned_int,_bool>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subpass_to_framebuffer_fetch_attachment).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subpass_to_framebuffer_fetch_attachment).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pls_outputs).
  super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pls_outputs).
  super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pls_inputs).
  super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pls_outputs).
  super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pls_inputs).
  super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pls_inputs).
  super__Vector_base<diligent_spirv_cross::PlsRemap,_std::allocator<diligent_spirv_cross::PlsRemap>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->temporary_to_mirror_precision_alias)._M_h._M_buckets =
       &(this->temporary_to_mirror_precision_alias)._M_h._M_single_bucket;
  (this->temporary_to_mirror_precision_alias)._M_h._M_bucket_count = 1;
  (this->temporary_to_mirror_precision_alias)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->temporary_to_mirror_precision_alias)._M_h._M_element_count = 0;
  (this->temporary_to_mirror_precision_alias)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->temporary_to_mirror_precision_alias)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->temporary_to_mirror_precision_alias)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->composite_insert_overwritten)._M_h._M_buckets =
       &(this->composite_insert_overwritten)._M_h._M_single_bucket;
  (this->composite_insert_overwritten)._M_h._M_bucket_count = 1;
  (this->composite_insert_overwritten)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->composite_insert_overwritten)._M_h._M_element_count = 0;
  (this->composite_insert_overwritten)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->composite_insert_overwritten)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->composite_insert_overwritten)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->block_composite_insert_overwrite)._M_h._M_buckets =
       &(this->block_composite_insert_overwrite)._M_h._M_single_bucket;
  (this->block_composite_insert_overwrite)._M_h._M_bucket_count = 1;
  (this->block_composite_insert_overwrite)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->block_composite_insert_overwrite)._M_h._M_element_count = 0;
  (this->block_composite_insert_overwrite)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->block_composite_insert_overwrite)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->block_composite_insert_overwrite)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->current_locale_radix_character = '.';
  (this->masked_output_locations)._M_h._M_buckets =
       &(this->masked_output_locations)._M_h._M_single_bucket;
  (this->masked_output_locations)._M_h._M_bucket_count = 1;
  (this->masked_output_locations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->masked_output_locations)._M_h._M_element_count = 0;
  (this->masked_output_locations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->masked_output_locations)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->masked_output_locations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->masked_output_builtins)._M_h._M_buckets =
       &(this->masked_output_builtins)._M_h._M_single_bucket;
  (this->masked_output_builtins)._M_h._M_bucket_count = 1;
  (this->masked_output_builtins)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->masked_output_builtins)._M_h._M_element_count = 0;
  (this->masked_output_builtins)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->masked_output_builtins)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->masked_output_builtins)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->float_formatter = (FloatFormatter *)0x0;
  (this->const_composite_insert_ids)._M_h._M_buckets =
       &(this->const_composite_insert_ids)._M_h._M_single_bucket;
  (this->const_composite_insert_ids)._M_h._M_bucket_count = 1;
  (this->const_composite_insert_ids)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->const_composite_insert_ids)._M_h._M_element_count = 0;
  (this->const_composite_insert_ids)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->const_composite_insert_ids)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->const_composite_insert_ids)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  init(this,ctx);
  return;
}

Assistant:

explicit CompilerGLSL(std::vector<uint32_t> spirv_)
	    : Compiler(std::move(spirv_))
	{
		init();
	}